

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

sunrealtype N_VL1Norm_Serial(N_Vector x)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  lVar1 = *x->content;
  if (0 < lVar1) {
    dVar3 = 0.0;
    lVar2 = 0;
    do {
      dVar3 = dVar3 + ABS(*(double *)(*(long *)((long)x->content + 0x10) + lVar2 * 8));
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
    return dVar3;
  }
  return 0.0;
}

Assistant:

sunrealtype N_VL1Norm_Serial(N_Vector x)
{
  sunindextype i, N;
  sunrealtype sum, *xd;

  sum = ZERO;
  xd  = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i < N; i++) { sum += SUNRabs(xd[i]); }

  return (sum);
}